

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

ElementDocument * __thiscall Rml::Context::GetDocument(Context *this,String *id)

{
  size_t __n;
  int iVar1;
  int iVar2;
  Element *this_00;
  ElementDocument *this_01;
  String *pSVar3;
  
  iVar1 = Element::GetNumChildren
                    ((this->root)._M_t.
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      this_00 = Element::GetChild((this->root)._M_t.
                                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                  .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,iVar1);
      this_01 = Element::GetOwnerDocument(this_00);
      if (this_01 != (ElementDocument *)0x0) {
        pSVar3 = Element::GetId_abi_cxx11_(&this_01->super_Element);
        __n = pSVar3->_M_string_length;
        if (__n == id->_M_string_length) {
          if (__n == 0) {
            return this_01;
          }
          iVar2 = bcmp((pSVar3->_M_dataplus)._M_p,(id->_M_dataplus)._M_p,__n);
          if (iVar2 == 0) {
            return this_01;
          }
        }
      }
      iVar1 = iVar1 + 1;
      iVar2 = Element::GetNumChildren
                        ((this->root)._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    } while (iVar1 < iVar2);
  }
  return (ElementDocument *)0x0;
}

Assistant:

ElementDocument* Context::GetDocument(const String& id)
{
	for (int i = 0; i < root->GetNumChildren(); i++)
	{
		ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
		if (document == nullptr)
			continue;

		if (document->GetId() == id)
			return document;
	}

	return nullptr;
}